

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O1

void duckdb::QuantileOperation::
     Operation<signed_char,duckdb::QuantileState<signed_char,duckdb::QuantileStandardType>,duckdb::QuantileListOperation<signed_char,true>>
               (QuantileState<signed_char,_duckdb::QuantileStandardType> *state,char *input,
               AggregateUnaryInput *aggr_input)

{
  pointer *ppcVar1;
  iterator __position;
  char local_1;
  
  __position._M_current =
       (state->v).super_vector<signed_char,_std::allocator<signed_char>_>.
       super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  if (__position._M_current ==
      (state->v).super_vector<signed_char,_std::allocator<signed_char>_>.
      super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    ::std::vector<signed_char,_std::allocator<signed_char>_>::_M_realloc_insert<signed_char>
              ((vector<signed_char,_std::allocator<signed_char>_> *)state,__position,&local_1);
  }
  else {
    *__position._M_current = *input;
    ppcVar1 = &(state->v).super_vector<signed_char,_std::allocator<signed_char>_>.
               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppcVar1 = *ppcVar1 + 1;
  }
  return;
}

Assistant:

static void Operation(STATE &state, const INPUT_TYPE &input, AggregateUnaryInput &aggr_input) {
		state.AddElement(input, aggr_input.input);
	}